

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

Ptr __thiscall core::image::rescale_double_size_supersample<float>(image *this,ConstPtr *img)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  long *plVar5;
  pointer pfVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Image<float> *__p;
  uint uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  Ptr PVar20;
  
  peVar4 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = (peVar4->super_TypedImageBase<float>).super_ImageBase.w;
  iVar16 = (peVar4->super_TypedImageBase<float>).super_ImageBase.h;
  uVar2 = (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
  __p = (Image<float> *)operator_new(0x30);
  (__p->super_TypedImageBase<float>).super_ImageBase.w = 0;
  (__p->super_TypedImageBase<float>).super_ImageBase.h = 0;
  (__p->super_TypedImageBase<float>).super_ImageBase.c = 0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase =
       (_func_int **)&PTR__TypedImageBase_0012fb60;
  *(Image<float> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<float>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  plVar5 = *(long **)this;
  (**(code **)(*plVar5 + 0x40))(plVar5);
  uVar10 = iVar1 * 2;
  uVar11 = iVar16 * 2;
  *(uint *)(plVar5 + 1) = uVar10;
  *(uint *)((long)plVar5 + 0xc) = uVar11;
  *(uint *)(plVar5 + 2) = uVar2;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(plVar5 + 3),
             (long)(int)(uVar11 * uVar10 * uVar2));
  _Var13._M_pi = extraout_RDX;
  if (0 < (int)uVar11) {
    iVar16 = 0;
    uVar12 = 0;
    do {
      uVar14 = uVar12 + 1;
      _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (0 < (int)uVar10) {
        uVar15 = (uVar12 >> 1) * iVar1;
        peVar4 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar3 = (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
        pfVar6 = (peVar4->super_TypedImageBase<float>).data.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        lVar7 = *(long *)this;
        uVar12 = (((int)uVar14 < (int)uVar11) + uVar12 >> 1) * iVar1;
        _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar12;
        uVar19 = 0;
        do {
          uVar17 = (int)uVar19 + 1;
          if (0 < (int)uVar2) {
            iVar9 = (int)(uVar19 >> 1);
            _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar15;
            lVar8 = *(long *)(lVar7 + 0x18);
            uVar18 = (uint)((int)uVar17 < (int)uVar10) + (int)uVar19 >> 1;
            uVar19 = 0;
            do {
              *(float *)((long)iVar16 * 4 + lVar8 + uVar19 * 4) =
                   pfVar6[(long)(int)((uVar12 + uVar18) * iVar3) + uVar19] * 0.25 +
                   pfVar6[(long)(int)((uVar12 + iVar9) * iVar3) + uVar19] * 0.25 +
                   pfVar6[(long)(int)((iVar9 + uVar15) * iVar3) + uVar19] * 0.25 +
                   pfVar6[(long)(int)((uVar18 + uVar15) * iVar3) + uVar19] * 0.25;
              uVar19 = uVar19 + 1;
            } while (uVar2 != uVar19);
            iVar16 = iVar16 + (int)uVar19;
          }
          uVar19 = (ulong)uVar17;
        } while (uVar17 != uVar10);
      }
      uVar12 = uVar14;
    } while (uVar14 != uVar11);
  }
  PVar20.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  PVar20.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar20.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
rescale_double_size_supersample (typename Image<T>::ConstPtr img)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = iw << 1;
    int const oh = ih << 1;

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    int witer = 0;
    for (int y = 0; y < oh; ++y)
    {
        bool nexty = (y + 1 < oh);
        int yoff[2] = { iw * (y >> 1), iw * ((y + nexty) >> 1) };
        for (int x = 0; x < ow; ++x)
        {
            bool nextx = (x + 1 < ow);
            int xoff[2] = { x >> 1, (x + nextx) >> 1 };
            T const* val[4] =
            {
                &img->at(yoff[0] + xoff[0], 0),
                &img->at(yoff[0] + xoff[1], 0),
                &img->at(yoff[1] + xoff[0], 0),
                &img->at(yoff[1] + xoff[1], 0)
            };

            for (int c = 0; c < ic; ++c, ++witer)
                out->at(witer) = math::interpolate
                    (val[0][c], val[1][c], val[2][c], val[3][c],
                    0.25f, 0.25f, 0.25f, 0.25f);
        }
    }

    return out;
}